

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

void __thiscall cmCTestSVN::ExternalParser::~ExternalParser(ExternalParser *this)

{
  ~ExternalParser(this);
  operator_delete(this,0x278);
  return;
}

Assistant:

ExternalParser(cmCTestSVN* svn, const char* prefix)
    : SVN(svn)
  {
    this->SetLog(&svn->Log, prefix);
    this->RegexExternal.compile("^X..... +(.+)$");
  }